

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

void do_reduce(DisasContext_conflict1 *s,arg_rpr_esz *a,gen_helper_fp_reduce *fn)

{
  uint oprsz;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  TCGv_i32 pTVar4;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGv_ptr pTVar5;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  oprsz = s->sve_len;
  uVar2 = (ulong)oprsz - 1;
  if (uVar2 == 0) {
    uVar3 = 0x40;
  }
  else {
    uVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x3f;
  }
  uVar1 = (uint32_t)(oprsz == 0);
  if (uVar3 != 0) {
    uVar1 = (uint32_t)(0x8000000000000000 >> ((char)uVar3 - 1U & 0x3f));
  }
  uVar1 = simd_desc_aarch64(oprsz,uVar1,0);
  pTVar4 = tcg_const_i32_aarch64(tcg_ctx,uVar1);
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  ts_01 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
             (long)(a->rn * 0x100 + 0xc10));
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)((long)ts_01 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
             (long)(a->pg * 0x20 + 0x2c10));
  pTVar5 = get_fpstatus_ptr_aarch64(tcg_ctx,a->esz == 1);
  (*fn)(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_ptr)((long)ts_00 - (long)tcg_ctx),
        (TCGv_ptr)((long)ts_01 - (long)tcg_ctx),pTVar5,pTVar4);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts_00);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts_01);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  write_fp_dreg_aarch64(s,a->rd,(TCGv_i64)((long)ts - (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  return;
}

Assistant:

static void do_reduce(DisasContext *s, arg_rpr_esz *a,
                      gen_helper_fp_reduce *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    unsigned p2vsz = pow2ceil(vsz);
    TCGv_i32 t_desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, p2vsz, 0));
    TCGv_ptr t_zn, t_pg, status;
    TCGv_i64 temp;

    temp = tcg_temp_new_i64(tcg_ctx);
    t_zn = tcg_temp_new_ptr(tcg_ctx);
    t_pg = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_zn, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rn));
    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));
    status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);

    fn(tcg_ctx, temp, t_zn, t_pg, status, t_desc);
    tcg_temp_free_ptr(tcg_ctx, t_zn);
    tcg_temp_free_ptr(tcg_ctx, t_pg);
    tcg_temp_free_ptr(tcg_ctx, status);
    tcg_temp_free_i32(tcg_ctx, t_desc);

    write_fp_dreg(s, a->rd, temp);
    tcg_temp_free_i64(tcg_ctx, temp);
}